

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O0

void __thiscall embree::BarrierSys::BarrierSys(BarrierSys *this,size_t N)

{
  MutexSys *this_00;
  void *in_RSI;
  undefined8 *in_RDI;
  MutexSys *pMVar1;
  ConditionSys *in_stack_ffffffffffffffb8;
  
  this_00 = (MutexSys *)operator_new(0x20);
  pMVar1 = this_00;
  MutexSys::MutexSys(this_00);
  ConditionSys::ConditionSys(in_stack_ffffffffffffffb8);
  this_00[2].mutex = (void *)0x0;
  this_00[3].mutex = (void *)0x0;
  this_00[2].mutex = (void *)0x0;
  this_00[3].mutex = in_RSI;
  *in_RDI = pMVar1;
  return;
}

Assistant:

BarrierSys::BarrierSys (size_t N) {
    opaque = new BarrierSysImplementation(N);
  }